

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O2

bool __thiscall soul::Value::PackedData::getAsBool(PackedData *this)

{
  Category CVar1;
  Primitive PVar2;
  Type *pTVar3;
  uchar uVar4;
  int64_t iVar5;
  bool bVar6;
  double dVar7;
  
  pTVar3 = this->type;
  CVar1 = pTVar3->category;
  if (((5 < CVar1) || ((0x32U >> (CVar1 & 0x1f) & 1) == 0)) &&
     ((CVar1 != vector || (pTVar3->boundingSize != 1)))) {
    throwInternalCompilerError
              ("type.isPrimitive() || type.isBoundedInt() || type.isVectorOfSize1()","getAsBool",
               0x8b);
  }
  PVar2 = (pTVar3->primitiveType).type;
  if (PVar2 == bool_) {
    uVar4 = getAs<unsigned_char>(this);
    bVar6 = uVar4 == '\0';
  }
  else {
    if (1 < PVar2 - int32) {
      if ((PVar2 & ~void_) == float32) {
        dVar7 = getAsDouble(this);
        return (bool)(-(dVar7 != 0.0) & 1);
      }
      throwInternalCompilerError("getAsBool",0x91);
    }
    iVar5 = getAsInt64(this);
    bVar6 = iVar5 == 0;
  }
  return !bVar6;
}

Assistant:

bool getAsBool() const
    {
        SOUL_ASSERT (type.isPrimitive() || type.isBoundedInt() || type.isVectorOfSize1());

        if (type.isBool())           return getAs<uint8_t>() != 0;
        if (type.isInteger())        return getAsInt64() != 0;
        if (type.isFloatingPoint())  return getAsDouble() != 0;

        SOUL_ASSERT_FALSE;
        return false;
    }